

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_deserializer.hpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::BinaryDeserializer::Deserialize<duckdb::LogicalOperator>(BinaryDeserializer *this)

{
  pointer *__ptr;
  BinaryDeserializer *in_RSI;
  
  OnObjectBegin(in_RSI);
  LogicalOperator::Deserialize((LogicalOperator *)this,&in_RSI->super_Deserializer);
  OnObjectEnd(in_RSI);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<T> Deserialize() {
		OnObjectBegin();
		auto result = T::Deserialize(*this);
		OnObjectEnd();
		D_ASSERT(nesting_level == 0); // make sure we are at the root level
		return result;
	}